

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

handle pybind11::detail::list_caster<std::vector<LinkView,std::allocator<LinkView>>,LinkView>::
       cast<std::vector<LinkView,std::allocator<LinkView>>>
                 (vector<LinkView,_std::allocator<LinkView>_> *src,return_value_policy policy,
                 handle parent)

{
  void *pvVar1;
  PyObject *tmp;
  handle hVar2;
  long lVar3;
  void *vsrc;
  void *src_00;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar4;
  list l;
  object value_;
  handle local_40;
  object local_38;
  
  list::list((list *)&local_40,(*(long *)(src + 8) - *(long *)src >> 3) * -0x3333333333333333);
  src_00 = *(void **)src;
  pvVar1 = *(void **)(src + 8);
  if (src_00 != pvVar1) {
    lVar3 = 0;
    do {
      pVar4 = type_caster_generic::src_and_type
                        (src_00,(type_info *)&LinkView::typeinfo,(type_info *)0x0);
      hVar2 = type_caster_generic::cast
                        (pVar4.first,move,parent,pVar4.second,
                         anon_func::anon_class_1_0_00000001::__invoke,
                         anon_func::anon_class_1_0_00000001::__invoke,(void *)0x0);
      if (hVar2.m_ptr == (PyObject *)0x0) {
        local_38.super_handle = hVar2;
        object::~object(&local_38);
        hVar2.m_ptr = (PyObject *)0x0;
        goto LAB_001c3a47;
      }
      local_38.super_handle.m_ptr = (handle)(PyObject *)0x0;
      *(PyObject **)((long)&((local_40.m_ptr[1].ob_type)->ob_base).ob_base.ob_refcnt + lVar3) =
           hVar2.m_ptr;
      object::~object(&local_38);
      src_00 = (void *)((long)src_00 + 0x28);
      lVar3 = lVar3 + 8;
    } while (src_00 != pvVar1);
  }
  hVar2.m_ptr = local_40.m_ptr;
  local_40.m_ptr = (PyObject *)0x0;
LAB_001c3a47:
  object::~object((object *)&local_40);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Value>::policy(policy);
        list l(src.size());
        size_t index = 0;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(value_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_)
                return handle();
            PyList_SET_ITEM(l.ptr(), (ssize_t) index++, value_.release().ptr()); // steals a reference
        }
        return l.release();
    }